

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# storage.hpp
# Opt level: O2

uchar * pstore::storage::address_to_raw_pointer_impl<pstore::storage_const,unsigned_char_const*>
                  (storage *storage,address addr)

{
  bool bVar1;
  sat_entry *this;
  
  this = (sat_entry *)
         ((long)((storage->sat_)._M_t.
                 super___uniq_ptr_impl<std::array<pstore::sat_entry,_65536UL>,_std::default_delete<std::array<pstore::sat_entry,_65536UL>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_std::array<pstore::sat_entry,_65536UL>_*,_std::default_delete<std::array<pstore::sat_entry,_65536UL>_>_>
                 .super__Head_base<0UL,_std::array<pstore::sat_entry,_65536UL>_*,_false>.
                _M_head_impl)->_M_elems + (ulong)(((uint)(addr.a_ >> 0x16) & 0xffff) << 5));
  bVar1 = sat_entry::is_valid(this);
  if (bVar1) {
    return (uchar *)((ulong)((uint)addr.a_ & 0x3fffff) +
                    (long)(this->value).super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
    ;
  }
  assert_failed("e.is_valid ()",
                "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/core/storage.hpp"
                ,0x11f);
}

Assistant:

inline ResultType storage::address_to_raw_pointer_impl (Storage & storage,
                                                            address const addr) noexcept {

        address::segment_type const segment = addr.segment ();
        PSTORE_ASSERT (segment < storage.sat_->size ());
        sat_entry & e = (*storage.sat_)[segment];
        PSTORE_ASSERT (e.is_valid ());
        return static_cast<ResultType> (static_cast<std::uint8_t *> (e.value.get ()) +
                                        addr.offset ());
    }